

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall
testing::internal::ForkingDeathTest::ForkingDeathTest
          (ForkingDeathTest *this,char *a_statement,RE *a_regex)

{
  char *in_RDX;
  DeathTestImpl *in_RSI;
  RE *in_RDI;
  
  DeathTestImpl::DeathTestImpl(in_RSI,in_RDX,in_RDI);
  *(undefined ***)in_RDI = &PTR__ForkingDeathTest_00194530;
  *(undefined4 *)(in_RDI + 0x2c) = 0xffffffff;
  return;
}

Assistant:

ForkingDeathTest::ForkingDeathTest(const char* a_statement, const RE* a_regex)
    : DeathTestImpl(a_statement, a_regex),
      child_pid_(-1) {}